

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.h
# Opt level: O1

void __thiscall llvm::formatv_object_base::format(formatv_object_base *this,raw_ostream *S)

{
  pointer pRVar1;
  pointer ppfVar2;
  ReplacementItem *R;
  pointer pRVar3;
  undefined1 local_50 [8];
  FmtAlign Align;
  
  pRVar3 = (this->Replacements).
           super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>._M_impl
           .super__Vector_impl_data._M_start;
  pRVar1 = (this->Replacements).
           super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pRVar3 != pRVar1) {
    do {
      if (pRVar3->Type != Empty) {
        if (pRVar3->Type != Literal) {
          ppfVar2 = (this->Adapters).
                    super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (pRVar3->Index <
              (ulong)((long)(this->Adapters).
                            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppfVar2 >> 3)) {
            local_50 = (undefined1  [8])ppfVar2[pRVar3->Index];
            Align.Adapter._0_4_ = pRVar3->Where;
            Align._8_8_ = pRVar3->Align;
            Align.Amount._0_1_ = pRVar3->Pad;
            FmtAlign::format((FmtAlign *)local_50,S,pRVar3->Options);
            goto LAB_00db585b;
          }
        }
        raw_ostream::operator<<(S,pRVar3->Spec);
      }
LAB_00db585b:
      pRVar3 = pRVar3 + 1;
    } while (pRVar3 != pRVar1);
  }
  return;
}

Assistant:

void format(raw_ostream &S) const {
    for (auto &R : Replacements) {
      if (R.Type == ReplacementType::Empty)
        continue;
      if (R.Type == ReplacementType::Literal) {
        S << R.Spec;
        continue;
      }
      if (R.Index >= Adapters.size()) {
        S << R.Spec;
        continue;
      }

      auto W = Adapters[R.Index];

      FmtAlign Align(*W, R.Where, R.Align, R.Pad);
      Align.format(S, R.Options);
    }
  }